

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

void __thiscall CBanDB::CBanDB(CBanDB *this,path ban_list_path)

{
  path *in_RSI;
  long in_FS_OFFSET;
  path local_70;
  path local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&local_48,in_RSI);
  fs::operator+(&this->m_banlist_dat,(path *)&local_48,".dat");
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::path(&local_70,in_RSI);
  fs::operator+(&this->m_banlist_json,(path *)&local_70,".json");
  std::filesystem::__cxx11::path::~path(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CBanDB::CBanDB(fs::path ban_list_path)
    : m_banlist_dat(ban_list_path + ".dat"),
      m_banlist_json(ban_list_path + ".json")
{
}